

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O2

void Curl_unencode_cleanup(Curl_easy *data)

{
  contenc_writer *pcVar1;
  
  while (pcVar1 = (data->req).writer_stack, pcVar1 != (contenc_writer *)0x0) {
    (data->req).writer_stack = pcVar1->downstream;
    (*pcVar1->handler->close_writer)(data,pcVar1);
    (*Curl_cfree)(pcVar1);
  }
  return;
}

Assistant:

void Curl_unencode_cleanup(struct Curl_easy *data)
{
  struct SingleRequest *k = &data->req;
  struct contenc_writer *writer = k->writer_stack;

  while(writer) {
    k->writer_stack = writer->downstream;
    writer->handler->close_writer(data, writer);
    free(writer);
    writer = k->writer_stack;
  }
}